

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

void __thiscall slang::TextDiagnosticClient::TextDiagnosticClient(TextDiagnosticClient *this)

{
  (this->super_DiagnosticClient).engine = (DiagnosticEngine *)0x0;
  (this->super_DiagnosticClient).sourceManager = (SourceManager *)0x0;
  (this->super_DiagnosticClient).absPaths = false;
  (this->super_DiagnosticClient)._vptr_DiagnosticClient =
       (_func_int **)&PTR__TextDiagnosticClient_005956d8;
  std::make_unique<slang::FormatBuffer>();
  this->includeFileStack = true;
  this->includeExpansion = true;
  this->includeColumn = true;
  this->includeLocation = true;
  this->includeSource = true;
  this->includeOptionName = true;
  this->includeHierarchy = Auto;
  *(undefined4 *)&(this->super_DiagnosticClient).field_0x19 = 0x5b5b5d5a;
  *(undefined2 *)&(this->super_DiagnosticClient).field_0x1d = 0x245c;
  (this->super_DiagnosticClient).field_0x1f = 0x60;
  return;
}

Assistant:

TextDiagnosticClient::TextDiagnosticClient() : buffer(std::make_unique<FormatBuffer>()) {
    noteColor = fmt::terminal_color::bright_black;
    warningColor = fmt::terminal_color::bright_yellow;
    errorColor = fmt::terminal_color::bright_red;
    fatalColor = fmt::terminal_color::bright_red;
    highlightColor = fmt::terminal_color::bright_green;
    filenameColor = fmt::terminal_color::cyan;
    locationColor = fmt::terminal_color::bright_cyan;
}